

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_operator_equal_Test::~Transaction_operator_equal_Test
          (Transaction_operator_equal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Transaction, operator_equal) {
  Transaction copy_tx(exp_tx_legacy);
  Transaction tx(3, 3);
  EXPECT_NO_THROW(tx = copy_tx);

  EXPECT_EQ(tx.GetVersion(), exp_version);
  EXPECT_EQ(tx.GetLockTime(), exp_locktime);
  EXPECT_STREQ(
      Txid(tx.GetHash()).GetHex().c_str(),
      "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  EXPECT_STREQ(
      tx.GetTxid().GetHex().c_str(),
      "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  EXPECT_EQ(tx.GetTotalSize(), 189);
  EXPECT_EQ(tx.GetVsize(), 189);
  EXPECT_EQ(tx.GetWeight(), 756);
  EXPECT_NO_THROW(tx.GetTxIn(0));
  EXPECT_THROW(tx.GetTxIn(1), CfdException);
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
  EXPECT_NO_THROW(tx.GetTxOut(0));
  EXPECT_THROW(tx.GetTxOut(1), CfdException);
  EXPECT_EQ(tx.GetWallyFlag(), 1);
  EXPECT_EQ(tx.HasWitness(), false);
}